

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O2

Ivy_Obj_t * Ivy_And(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  
  pIVar2 = p0;
  if (p0 != p1) {
    if ((Ivy_Obj_t *)((ulong)p1 ^ 1) == p0) {
      pIVar2 = (Ivy_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    else {
      pIVar1 = p->pConst1;
      if (pIVar1 == (Ivy_Obj_t *)((ulong)p0 & 0xfffffffffffffffe)) {
        pIVar2 = p1;
        if ((Ivy_Obj_t *)((ulong)p0 & 0xfffffffffffffffe) != p0) {
          pIVar2 = (Ivy_Obj_t *)((ulong)p0 | 1);
        }
      }
      else {
        if (pIVar1 != (Ivy_Obj_t *)((ulong)p1 & 0xfffffffffffffffe)) {
          pIVar2 = Ivy_ObjCreateGhost(p,p0,p1,IVY_AND,IVY_INIT_NONE);
          pIVar2 = Ivy_CanonPair_rec(p,pIVar2);
          return pIVar2;
        }
        if (pIVar1 != p1) {
          pIVar2 = (Ivy_Obj_t *)((ulong)pIVar1 ^ 1);
        }
      }
    }
  }
  return pIVar2;
}

Assistant:

Ivy_Obj_t * Ivy_And( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1 )
{
//    Ivy_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Ivy_Not(p1) )
        return Ivy_Not(p->pConst1);
    if ( Ivy_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Ivy_Not(p->pConst1);
    if ( Ivy_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Ivy_Not(p->pConst1);
    // check if it can be an EXOR gate
//    if ( Ivy_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
//        return Ivy_CanonExor( pFan0, pFan1 );
    return Ivy_CanonAnd( p, p0, p1 );
}